

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forwardDilation
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,conv_func conv,Option *opt)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  ulong _elemsize;
  int *piVar4;
  undefined4 uVar8;
  Allocator *pAVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar9;
  bool bVar10;
  Mat *pMVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  void *pvVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  void *pvVar20;
  undefined4 *puVar21;
  int _w;
  undefined4 *puVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  undefined4 *puVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Mat inner_bottom_blob;
  Mat inner_top_blob;
  undefined1 local_158 [16];
  ulong local_148;
  Allocator *local_140;
  int local_138;
  undefined8 uStack_134;
  int iStack_12c;
  size_t local_128;
  ulong local_118;
  long local_110;
  long local_108;
  Mat *local_100;
  int local_f8;
  int local_f4;
  long local_f0;
  long local_e8;
  Mat *local_e0;
  ulong local_d8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  Mat *local_b8;
  Mat *local_b0;
  ulong local_a8;
  conv_func local_a0;
  ulong local_98;
  long local_90;
  undefined1 local_88 [16];
  Option opt_g;
  
  iVar1 = bottom_blob->w;
  iVar13 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  uVar28 = (this->super_Convolution).kernel_w;
  local_d0 = (ulong)uVar28;
  uVar18 = (this->super_Convolution).dilation_w;
  local_d8 = (ulong)uVar18;
  iVar2 = (this->super_Convolution).stride_w;
  piVar4 = bottom_blob->refcount;
  local_158._0_8_ = bottom_blob->data;
  local_158._8_8_ = bottom_blob->refcount;
  local_140 = bottom_blob->allocator;
  local_138 = bottom_blob->dims;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  iVar30 = (uVar28 - 1) * uVar18;
  uVar3 = bottom_blob->w;
  uVar8 = bottom_blob->h;
  uStack_134._4_4_ = uVar8;
  uStack_134._0_4_ = uVar3;
  iStack_12c = bottom_blob->c;
  local_128 = bottom_blob->cstep;
  iVar19 = (this->super_Convolution).pad_w;
  local_148 = _elemsize;
  local_e0 = top_blob;
  local_a0 = conv;
  if ((iVar19 < 1) && (iVar24 = (this->super_Convolution).pad_h, iVar24 < 1)) {
    local_100 = bottom_blob;
    if (iVar24 == -0xe9 && iVar19 == -0xe9) {
      iVar24 = iVar30 - (iVar1 + -1) % iVar2;
      iVar19 = iVar30 - (iVar13 + -1) % iVar2;
      if ((iVar24 < 1) && (iVar19 < 1)) {
LAB_0010ba3a:
        bVar10 = true;
        iVar13 = uStack_134._4_4_;
        iVar1 = (int)uStack_134;
      }
      else {
        copy_make_border(bottom_blob,(Mat *)local_158,iVar19 / 2,iVar19 - iVar19 / 2,iVar24 / 2,
                         iVar24 - iVar24 / 2,0,0.0,opt->workspace_allocator,opt->num_threads);
        if ((void *)local_158._0_8_ == (void *)0x0) {
          bVar10 = false;
        }
        else {
          if ((long)iStack_12c * local_128 != 0) goto LAB_0010ba3a;
          bVar10 = false;
        }
      }
      iVar19 = -100;
      if (!bVar10) goto LAB_0010bacb;
    }
  }
  else {
    iVar1 = (this->super_Convolution).pad_h;
    copy_make_border(bottom_blob,(Mat *)local_158,iVar1,iVar1,iVar19,iVar19,0,0.0,
                     opt->workspace_allocator,opt->num_threads);
    iVar19 = -100;
    if ((void *)local_158._0_8_ == (void *)0x0) goto LAB_0010bacb;
    local_100 = bottom_blob;
    if ((long)iStack_12c * local_128 == 0) goto LAB_0010bacb;
    iVar13 = uStack_134._4_4_;
    iVar1 = (int)uStack_134;
  }
  pMVar11 = local_e0;
  iVar24 = (iVar1 - (iVar30 + 1)) / iVar2;
  _w = iVar24 + 1;
  Mat::create(local_e0,_w,(iVar13 - (iVar30 + 1)) / iVar2 + 1,(this->super_Convolution).num_output,
              _elemsize,opt->blob_allocator);
  uVar12 = local_d8;
  iVar19 = -100;
  if ((pMVar11->data != (void *)0x0) && ((long)pMVar11->c * pMVar11->cstep != 0)) {
    inner_bottom_blob.dims = 0;
    inner_bottom_blob.w = 0;
    inner_bottom_blob.h = 0;
    inner_bottom_blob.c = 0;
    inner_bottom_blob.elemsize = 0;
    inner_bottom_blob.allocator = (Allocator *)0x0;
    inner_bottom_blob.data = (void *)0x0;
    inner_bottom_blob.refcount = (int *)0x0;
    iVar19 = 0;
    inner_bottom_blob.cstep = 0;
    inner_top_blob.cstep = 0;
    inner_top_blob.dims = 0;
    inner_top_blob.w = 0;
    inner_top_blob.h = 0;
    inner_top_blob.c = 0;
    inner_top_blob.elemsize = 0;
    inner_top_blob.allocator = (Allocator *)0x0;
    inner_top_blob.data = (void *)0x0;
    inner_top_blob.refcount = (int *)0x0;
    iVar30 = (int)local_d8;
    if (0 < iVar30) {
      local_f4 = iVar30 + iVar1 + -1;
      local_f8 = iVar30 + -1 + iVar13;
      local_b0 = &(this->super_Convolution).weight_data;
      local_b8 = &(this->super_Convolution).bias_data;
      local_c0 = (long)iVar1 << 2;
      local_c8 = (long)iVar24 * 4 + 4;
      local_88 = ZEXT416(3);
      local_108 = 0;
      local_110 = 0;
      local_118 = 0;
      do {
        uVar9 = (long)(local_f8 - (int)local_118) / (long)(int)local_d8;
        iVar13 = (int)uVar9;
        uVar15 = (long)(iVar13 - (int)local_d0) / (long)iVar2;
        local_98 = uVar15 & 0xffffffff;
        uVar28 = (int)uVar15 + 1;
        local_f0 = local_108;
        local_e8 = local_110;
        uVar15 = 0;
        do {
          uVar29 = (long)(local_f4 - (int)uVar15) / (long)(int)local_d8;
          iVar14 = (int)uVar29;
          iVar24 = (iVar14 - (int)local_d0) / iVar2;
          iVar19 = local_100->c;
          pAVar5 = opt->workspace_allocator;
          auVar32._0_4_ = -(uint)(local_88._0_4_ == inner_bottom_blob.dims);
          auVar32._4_4_ = -(uint)(iVar14 == inner_bottom_blob.w);
          auVar32._8_4_ = -(uint)(iVar13 == inner_bottom_blob.h);
          auVar32._12_4_ = -(uint)(iVar19 == inner_bottom_blob.c);
          iVar17 = movmskps((int)local_d8,auVar32);
          local_a8 = uVar15;
          if (((iVar17 != 0xf) || (inner_bottom_blob.allocator != pAVar5)) ||
             (inner_bottom_blob.elemsize != _elemsize)) {
            if (inner_bottom_blob.refcount != (int *)0x0) {
              LOCK();
              *inner_bottom_blob.refcount = *inner_bottom_blob.refcount + -1;
              UNLOCK();
              if (*inner_bottom_blob.refcount == 0) {
                if (inner_bottom_blob.allocator == (Allocator *)0x0) {
                  if (inner_bottom_blob.data != (void *)0x0) {
                    free(*(void **)((long)inner_bottom_blob.data + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)inner_bottom_blob.allocator + 8))();
                }
              }
            }
            inner_bottom_blob.data = (void *)0x0;
            inner_bottom_blob.refcount = (int *)0x0;
            inner_bottom_blob.allocator = pAVar5;
            inner_bottom_blob.elemsize = _elemsize;
            inner_bottom_blob.w = iVar14;
            inner_bottom_blob.dims = 3;
            inner_bottom_blob.h = iVar13;
            inner_bottom_blob.c = iVar19;
            uVar15 = (long)(iVar13 * iVar14) * _elemsize + 0xf & 0xfffffffffffffff0;
            inner_bottom_blob.cstep = uVar15 / _elemsize;
            if ((long)iVar19 * inner_bottom_blob.cstep != 0) {
              uVar23 = (long)iVar19 * inner_bottom_blob.cstep * _elemsize + 3 & 0xfffffffffffffffc;
              if (pAVar5 == (Allocator *)0x0) {
                pvVar16 = malloc(uVar23 + 0x1c);
                inner_bottom_blob.data = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
                *(void **)((long)inner_bottom_blob.data - 8) = pvVar16;
              }
              else {
                inner_bottom_blob.data =
                     (void *)(*(code *)**(undefined8 **)pAVar5)
                                       (pAVar5,uVar23 + 4,uVar15 % _elemsize);
              }
              inner_bottom_blob.refcount = (int *)((long)inner_bottom_blob.data + uVar23);
              *(undefined4 *)((long)inner_bottom_blob.data + uVar23) = 1;
            }
          }
          iVar19 = -100;
          if ((inner_bottom_blob.data == (void *)0x0) ||
             ((long)inner_bottom_blob.c * inner_bottom_blob.cstep == 0)) goto LAB_0010b932;
          uVar18 = iVar24 + 1;
          iVar19 = (this->super_Convolution).num_output;
          pAVar5 = opt->workspace_allocator;
          auVar31._0_4_ = -(uint)(local_88._0_4_ == inner_top_blob.dims);
          auVar31._4_4_ = -(uint)(uVar18 == inner_top_blob.w);
          auVar31._8_4_ = -(uint)(uVar28 == inner_top_blob.h);
          auVar31._12_4_ = -(uint)(iVar19 == inner_top_blob.c);
          iVar17 = movmskps(uVar18,auVar31);
          if ((iVar17 != 0xf) ||
             ((inner_top_blob.allocator != pAVar5 || (inner_top_blob.elemsize != _elemsize)))) {
            if (inner_top_blob.refcount != (int *)0x0) {
              LOCK();
              *inner_top_blob.refcount = *inner_top_blob.refcount + -1;
              UNLOCK();
              if (*inner_top_blob.refcount == 0) {
                if (inner_top_blob.allocator == (Allocator *)0x0) {
                  if (inner_top_blob.data != (void *)0x0) {
                    free(*(void **)((long)inner_top_blob.data + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)inner_top_blob.allocator + 8))();
                }
              }
            }
            inner_top_blob.data = (void *)0x0;
            inner_top_blob.refcount = (int *)0x0;
            inner_top_blob.allocator = pAVar5;
            inner_top_blob.elemsize = _elemsize;
            inner_top_blob.w = uVar18;
            inner_top_blob.dims = 3;
            inner_top_blob.h = uVar28;
            inner_top_blob.c = iVar19;
            uVar15 = (long)(int)(uVar28 * uVar18) * _elemsize + 0xf & 0xfffffffffffffff0;
            inner_top_blob.cstep = uVar15 / _elemsize;
            if ((long)iVar19 * inner_top_blob.cstep != 0) {
              uVar23 = (long)iVar19 * inner_top_blob.cstep * _elemsize + 3 & 0xfffffffffffffffc;
              if (pAVar5 == (Allocator *)0x0) {
                pvVar16 = malloc(uVar23 + 0x1c);
                inner_top_blob.data = (void *)((long)pvVar16 + 0x17U & 0xfffffffffffffff0);
                *(void **)((long)inner_top_blob.data - 8) = pvVar16;
              }
              else {
                inner_top_blob.data =
                     (void *)(*(code *)**(undefined8 **)pAVar5)
                                       (pAVar5,uVar23 + 4,uVar15 % _elemsize);
              }
              inner_top_blob.refcount = (int *)((long)inner_top_blob.data + uVar23);
              *(undefined4 *)((long)inner_top_blob.data + uVar23) = 1;
            }
          }
          iVar19 = -100;
          if ((inner_top_blob.data == (void *)0x0) ||
             ((long)inner_top_blob.c * inner_top_blob.cstep == 0)) goto LAB_0010b932;
          iVar19 = local_100->c;
          if (0 < (long)iVar19) {
            lVar25 = local_158._0_8_ + local_e8;
            local_90 = local_128 * local_148;
            lVar27 = 0;
            pvVar16 = inner_bottom_blob.data;
            do {
              if (0 < iVar13) {
                iVar17 = 0;
                uVar15 = 0;
                pvVar20 = pvVar16;
                do {
                  if (0 < iVar14) {
                    puVar21 = (undefined4 *)(lVar25 + (long)iVar17 * 4);
                    uVar23 = 0;
                    do {
                      *(undefined4 *)((long)pvVar20 + uVar23 * 4) = *puVar21;
                      uVar23 = uVar23 + 1;
                      puVar21 = puVar21 + uVar12;
                    } while ((uVar29 & 0xffffffff) != uVar23);
                  }
                  uVar15 = uVar15 + 1;
                  iVar17 = iVar17 + iVar1 * iVar30;
                  pvVar20 = (void *)((long)pvVar20 + (long)iVar14 * 4);
                } while (uVar15 != (uVar9 & 0xffffffff));
              }
              lVar27 = lVar27 + 1;
              lVar25 = lVar25 + local_90;
              pvVar16 = (void *)((long)pvVar16 +
                                inner_bottom_blob.cstep * inner_bottom_blob.elemsize);
            } while (lVar27 != iVar19);
          }
          opt_g.lightmode = opt->lightmode;
          opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
          opt_g.num_threads = opt->num_threads;
          opt_g.workspace_allocator = opt->workspace_allocator;
          opt_g.blob_allocator = inner_top_blob.allocator;
          (*local_a0)(&inner_bottom_blob,&inner_top_blob,local_b0,local_b8,&opt_g);
          lVar25 = (long)(this->super_Convolution).num_output;
          if (0 < lVar25) {
            sVar6 = local_e0->cstep;
            puVar21 = (undefined4 *)((long)local_e0->data + local_f0);
            sVar7 = local_e0->elemsize;
            lVar27 = 0;
            pvVar16 = inner_top_blob.data;
            do {
              if (-1 < (int)local_98) {
                uVar15 = 0;
                puVar26 = puVar21;
                pvVar20 = pvVar16;
                do {
                  if (-1 < iVar24) {
                    uVar29 = 0;
                    puVar22 = puVar26;
                    do {
                      *puVar22 = *(undefined4 *)((long)pvVar20 + uVar29 * 4);
                      uVar29 = uVar29 + 1;
                      puVar22 = puVar22 + uVar12;
                    } while (uVar18 != uVar29);
                  }
                  uVar15 = uVar15 + 1;
                  puVar26 = puVar26 + _w * iVar30;
                  pvVar20 = (void *)((long)pvVar20 + (long)(int)uVar18 * 4);
                } while (uVar15 != uVar28);
              }
              lVar27 = lVar27 + 1;
              puVar21 = (undefined4 *)((long)puVar21 + sVar6 * sVar7);
              pvVar16 = (void *)((long)pvVar16 + inner_top_blob.cstep * inner_top_blob.elemsize);
            } while (lVar27 != lVar25);
          }
          uVar15 = local_a8 + 1;
          local_e8 = local_e8 + 4;
          local_f0 = local_f0 + 4;
        } while (uVar15 != local_d8);
        local_118 = local_118 + 1;
        local_110 = local_110 + local_c0;
        local_108 = local_108 + local_c8;
        iVar19 = 0;
      } while (local_118 != local_d8);
    }
LAB_0010b932:
    if (inner_top_blob.refcount != (int *)0x0) {
      LOCK();
      *inner_top_blob.refcount = *inner_top_blob.refcount + -1;
      UNLOCK();
      if (*inner_top_blob.refcount == 0) {
        if (inner_top_blob.allocator == (Allocator *)0x0) {
          if (inner_top_blob.data != (void *)0x0) {
            free(*(void **)((long)inner_top_blob.data + -8));
          }
        }
        else {
          (**(code **)(*(long *)inner_top_blob.allocator + 8))();
        }
      }
    }
    if (inner_bottom_blob.refcount != (int *)0x0) {
      LOCK();
      *inner_bottom_blob.refcount = *inner_bottom_blob.refcount + -1;
      UNLOCK();
      if (*inner_bottom_blob.refcount == 0) {
        if (inner_bottom_blob.allocator == (Allocator *)0x0) {
          if (inner_bottom_blob.data != (void *)0x0) {
            free(*(void **)((long)inner_bottom_blob.data + -8));
          }
        }
        else {
          (**(code **)(*(long *)inner_bottom_blob.allocator + 8))();
        }
      }
    }
  }
LAB_0010bacb:
  if ((int *)local_158._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_158._8_8_ = *(int *)local_158._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_158._8_8_ == 0) {
      if (local_140 == (Allocator *)0x0) {
        if ((void *)local_158._0_8_ != (void *)0x0) {
          free(*(void **)(local_158._0_8_ + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_140 + 8))();
      }
    }
  }
  return iVar19;
}

Assistant:

int Convolution_x86::forwardDilation(const Mat& bottom_blob, Mat& top_blob, conv_func conv, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob_bordered.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            conv(inner_bottom_blob, inner_top_blob, weight_data, bias_data, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    return 0;
}